

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_finalize(Context *ctx)

{
  int iVar1;
  char *pcVar2;
  char local_68 [8];
  char buf [64];
  uint local_1c;
  int i;
  char *tmpstr;
  Context *ctx_local;
  
  push_output(ctx,&ctx->preflight);
  iVar1 = shader_is_vertex(ctx);
  if ((iVar1 != 0) && (ctx->arb1_wrote_position == 0)) {
    output_line(ctx,"OPTION ARB_position_invariant;");
  }
  iVar1 = shader_is_pixel(ctx);
  if ((iVar1 != 0) && (ctx->have_multi_color_outputs != 0)) {
    output_line(ctx,"OPTION ARB_draw_buffers;");
  }
  pop_output(ctx);
  pcVar2 = arb1_float_temp(ctx);
  push_output(ctx,&ctx->globals);
  for (local_1c = 0; (int)local_1c < ctx->max_scratch_registers; local_1c = local_1c + 1) {
    allocate_ARB1_scratch_reg_name(ctx,local_68,0x40);
    output_line(ctx,"%s %s;",pcVar2,local_68);
  }
  if (((ctx->profile_supports_nv2 != 0) && (iVar1 = shader_is_pixel(ctx), iVar1 == 0)) &&
     (ctx->profile_supports_nv4 == 0)) {
    for (local_1c = 0; (int)local_1c < ctx->max_reps; local_1c = local_1c + 1) {
      output_line(ctx,"TEMP rep%d;",(ulong)local_1c);
    }
  }
  pop_output(ctx);
  if (ctx->scratch_registers != ctx->max_scratch_registers) {
    __assert_fail("ctx->scratch_registers == ctx->max_scratch_registers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x1b38,"void emit_ARB1_finalize(Context *)");
  }
  return;
}

Assistant:

static void emit_ARB1_finalize(Context *ctx)
{
    push_output(ctx, &ctx->preflight);

    if (shader_is_vertex(ctx) && !ctx->arb1_wrote_position)
        output_line(ctx, "OPTION ARB_position_invariant;");

    if (shader_is_pixel(ctx) && ctx->have_multi_color_outputs)
        output_line(ctx, "OPTION ARB_draw_buffers;");

    pop_output(ctx);

    const char *tmpstr = arb1_float_temp(ctx);
    int i;
    push_output(ctx, &ctx->globals);
    for (i = 0; i < ctx->max_scratch_registers; i++)
    {
        char buf[64];
        allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "%s %s;", tmpstr, buf);
    } // for

    // nv2 fragment programs (and anything nv4) have a real REP/ENDREP.
    if ( (support_nv2(ctx)) && (!shader_is_pixel(ctx)) && (!support_nv4(ctx)) )
    {
        // set up temps for nv2 REP/ENDREP emulation through branching.
        for (i = 0; i < ctx->max_reps; i++)
            output_line(ctx, "TEMP rep%d;", i);
    } // if

    pop_output(ctx);
    assert(ctx->scratch_registers == ctx->max_scratch_registers);
}